

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnImportMemory
          (BinaryReaderInterp *this,Index import_index,string_view module_name,
          string_view field_name,Index memory_index,Limits *page_limits)

{
  ModuleDesc *pMVar1;
  bool bVar2;
  undefined1 local_110 [8];
  string local_108;
  string local_e8;
  ImportType local_c8;
  uint64_t local_80;
  uint64_t local_78;
  undefined8 local_70;
  undefined1 local_68 [8];
  MemoryType memory_type;
  Index import_index_local;
  BinaryReaderInterp *this_local;
  string_view field_name_local;
  string_view module_name_local;
  
  module_name_local.data_ = (char *)module_name.size_;
  field_name_local.size_ = (size_type)module_name.data_;
  field_name_local.data_ = (char *)field_name.size_;
  this_local = (BinaryReaderInterp *)field_name.data_;
  memory_type.limits._20_4_ = import_index;
  memory_type.limits._16_4_ =
       SharedValidator::OnMemory
                 (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                  page_limits);
  bVar2 = Failed((Result)memory_type.limits._16_4_);
  if (bVar2) {
    Result::Result((Result *)((long)&module_name_local.size_ + 4),Error);
  }
  else {
    local_80 = page_limits->initial;
    local_78 = page_limits->max;
    local_70._0_1_ = page_limits->has_max;
    local_70._1_1_ = page_limits->is_shared;
    local_70._2_6_ = *(undefined6 *)&page_limits->field_0x12;
    MemoryType::MemoryType((MemoryType *)local_68,*page_limits);
    pMVar1 = this->module_;
    string_view::to_string_abi_cxx11_(&local_e8,(string_view *)&field_name_local.size_);
    string_view::to_string_abi_cxx11_((string *)(local_110 + 8),(string_view *)&this_local);
    MemoryType::Clone((MemoryType *)local_110);
    ImportType::ImportType
              (&local_c8,&local_e8,(string *)(local_110 + 8),
               (unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                *)local_110);
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::push_back
              (&pMVar1->imports,(value_type *)&local_c8);
    ImportDesc::~ImportDesc((ImportDesc *)&local_c8);
    std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
    ~unique_ptr((unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                 *)local_110);
    std::__cxx11::string::~string((string *)(local_110 + 8));
    std::__cxx11::string::~string((string *)&local_e8);
    std::vector<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>::push_back
              (&this->memory_types_,(value_type *)local_68);
    Result::Result((Result *)((long)&module_name_local.size_ + 4),Ok);
    MemoryType::~MemoryType((MemoryType *)local_68);
  }
  return (Result)module_name_local.size_._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnImportMemory(Index import_index,
                                          string_view module_name,
                                          string_view field_name,
                                          Index memory_index,
                                          const Limits* page_limits) {
  CHECK_RESULT(validator_.OnMemory(loc, *page_limits));
  MemoryType memory_type{*page_limits};
  module_.imports.push_back(ImportDesc{ImportType(
      module_name.to_string(), field_name.to_string(), memory_type.Clone())});
  memory_types_.push_back(memory_type);
  return Result::Ok;
}